

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorypool.h
# Opt level: O0

void __thiscall
despot::MemoryPool<despot::POMDPXState>::Free
          (MemoryPool<despot::POMDPXState> *this,POMDPXState *obj)

{
  bool bVar1;
  POMDPXState *local_18;
  POMDPXState *obj_local;
  MemoryPool<despot::POMDPXState> *this_local;
  
  local_18 = obj;
  obj_local = (POMDPXState *)this;
  bVar1 = MemoryObject::IsAllocated(&(obj->super_State).super_MemoryObject);
  if (!bVar1) {
    __assert_fail("obj->IsAllocated()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/include/despot/util/memorypool.h"
                  ,0x3b,
                  "void despot::MemoryPool<despot::POMDPXState>::Free(T *) [T = despot::POMDPXState]"
                 );
  }
  MemoryObject::ClearAllocated(&(local_18->super_State).super_MemoryObject);
  std::vector<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>::push_back
            (&this->freelist_,&local_18);
  this->num_allocated_ = this->num_allocated_ + -1;
  return;
}

Assistant:

void Free(T* obj) {
		assert(obj->IsAllocated());
		obj->ClearAllocated();
		freelist_.push_back(obj);
		num_allocated_--;
	}